

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O0

sexp_conflict
sexp_signal_set_contains_p_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,sexp_conflict arg1)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  uint *in_RCX;
  long in_RSI;
  undefined8 in_RDI;
  int *in_R8;
  sexp_conflict res;
  int local_58;
  int local_50;
  sexp_conflict local_8;
  
  if ((((ulong)in_RCX & 3) == 0) &&
     (auVar1._8_8_ = (long)*(ulong *)(in_RSI + 0x30) >> 0x3f,
     auVar1._0_8_ = *(ulong *)(in_RSI + 0x30) & 0xfffffffffffffffe,
     (ulong)*in_RCX == SUB168(auVar1 / SEXT816(2),0))) {
    if ((((ulong)in_R8 & 1) == 1) || ((((ulong)in_R8 & 3) == 0 && (*in_R8 == 0xc)))) {
      if (((ulong)in_R8 & 1) == 1) {
        auVar3._8_8_ = (long)in_R8 >> 0x3f;
        auVar3._0_8_ = (ulong)in_R8 & 0xfffffffffffffffe;
        local_50 = SUB164(auVar3 / SEXT816(2),0);
      }
      else {
        if ((((ulong)in_R8 & 3) == 0) && (*in_R8 == 0xc)) {
          local_58 = (int)(char)in_R8[2] * (int)*(undefined8 *)(in_R8 + 6);
        }
        else {
          local_58 = 0;
        }
        local_50 = local_58;
      }
      iVar4 = sigismember(*(sigset_t **)(in_RCX + 6),local_50);
      local_8 = (sexp_conflict)0x3e;
      if (iVar4 != 0) {
        local_8 = (sexp_conflict)0x13e;
      }
    }
    else {
      local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,2,in_R8);
    }
  }
  else {
    auVar2._8_8_ = (long)*(ulong *)(in_RSI + 0x30) >> 0x3f;
    auVar2._0_8_ = *(ulong *)(in_RSI + 0x30) & 0xfffffffffffffffe;
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,SUB168(auVar2 / SEXT816(2),0),in_RCX)
    ;
  }
  return local_8;
}

Assistant:

sexp sexp_signal_set_contains_p_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1) {
  sexp res;
  if (! (sexp_pointerp(arg0) && (sexp_pointer_tag(arg0) == sexp_unbox_fixnum(sexp_opcode_arg1_type(self)))))
    return sexp_type_exception(ctx, self, sexp_unbox_fixnum(sexp_opcode_arg1_type(self)), arg0);
  if (! sexp_exact_integerp(arg1))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg1);
  res = sexp_make_boolean(sigismember((sigset_t*)sexp_cpointer_value(arg0), sexp_sint_value(arg1)));
  return res;
}